

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

int __thiscall
FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>_>
::size(FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>_>
       *this)

{
  int iVar1;
  int iVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
  *pFVar4;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar5;
  int iVar6;
  
  pFVar3 = (this->right_->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).right_;
  iVar1 = (((((pFVar3->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  pFVar5 = (pFVar4->fadexpr_).left_;
  iVar2 = ((*(Fad<double> **)((long)&((pFVar5->fadexpr_).left_)->fadexpr_ + 0x10))->dx_).num_elts;
  iVar6 = (((((pFVar5->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 < iVar2) {
    iVar6 = iVar2;
  }
  iVar2 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 <= iVar2) {
    iVar6 = iVar2;
  }
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  iVar1 = (((((this->right_->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 <= iVar1) {
    iVar6 = iVar1;
  }
  return iVar6;
}

Assistant:

int size() const { return right_.size();}